

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
AddAllocatedSlowWithCopy<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (RepeatedPtrFieldBase *this,Type *value,Arena *value_arena,Arena *my_arena)

{
  Type *pTVar1;
  
  pTVar1 = value;
  if (value_arena == (Arena *)0x0 && my_arena != (Arena *)0x0) {
    if (value == (Type *)0x0) {
      pTVar1 = (Type *)0x0;
    }
    else {
      ThreadSafeArena::AddCleanup
                ((ThreadSafeArena *)my_arena,value,arena_delete_object<std::__cxx11::string>);
    }
  }
  else if (my_arena != value_arena) {
    pTVar1 = Arena::Create<std::__cxx11::string>(my_arena);
    std::__cxx11::string::_M_assign((string *)pTVar1);
    StringTypeHandler::Delete(value,value_arena);
  }
  UnsafeArenaAddAllocated<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (this,pTVar1);
  return;
}

Assistant:

void RepeatedPtrFieldBase::AddAllocatedSlowWithCopy(
    // Pass value_arena and my_arena to avoid duplicate virtual call (value) or
    // load (mine).
    typename TypeHandler::Type* value, Arena* value_arena, Arena* my_arena) {
  // Ensure that either the value is in the same arena, or if not, we do the
  // appropriate thing: Own() it (if it's on heap and we're in an arena) or copy
  // it to our arena/heap (otherwise).
  if (my_arena != nullptr && value_arena == nullptr) {
    my_arena->Own(value);
  } else if (my_arena != value_arena) {
    typename TypeHandler::Type* new_value =
        TypeHandler::NewFromPrototype(value, my_arena);
    TypeHandler::Merge(*value, new_value);
    TypeHandler::Delete(value, value_arena);
    value = new_value;
  }

  UnsafeArenaAddAllocated<TypeHandler>(value);
}